

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O2

void check_handling(display *d,int def,png_uint_32 chunks,png_uint_32 known,png_uint_32 unknown,
                   char *position,int set_callback)

{
  anon_struct_32_7_46fe1f00 *name;
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint flag;
  
  pcVar4 = ",callback";
  if (set_callback == 0) {
    pcVar4 = "";
  }
  do {
    if (chunks == 0) {
      return;
    }
    flag = -chunks & chunks;
    uVar2 = find_by_flag(flag);
    name = chunk_info + uVar2;
    uVar1 = chunk_info[uVar2].keep;
    if (chunk_info[uVar2].unknown != 0) {
      pcVar6 = "UNKNOWN (specified)";
      if (uVar1 == 0) {
        pcVar6 = "UNKNOWN (default)";
      }
      if ((flag & known) != 0) {
        pcVar5 = "chunk processed";
        goto switchD_001033fa_caseD_0;
      }
      if (uVar1 == 0) {
        uVar1 = def;
      }
      switch(uVar1) {
      case 0:
        pcVar5 = "DEFAULT: unknown chunk saved";
        break;
      case 1:
        pcVar5 = "DISCARD: unknown chunk saved";
        break;
      case 2:
        iVar3 = ancillary(name->name);
        if (iVar3 != 0) {
          pcVar5 = "IF-SAFE: unknown ancillary chunk lost";
          goto LAB_00103431;
        }
        pcVar5 = "IF-SAFE: unknown critical chunk saved";
        break;
      case 3:
        pcVar5 = "SAVE: unknown chunk lost";
LAB_00103431:
        if ((unknown & flag) == 0) goto switchD_001033fa_caseD_0;
        goto LAB_001034be;
      default:
        pcVar5 = "internal error: bad keep";
        goto switchD_001033fa_caseD_0;
      }
      goto LAB_00103455;
    }
    if ((flag & known) != 0) {
      pcVar5 = "!DEFAULT: known chunk processed";
      pcVar6 = "KNOWN";
      goto joined_r0x0010339e;
    }
    pcVar5 = "DEFAULT: known chunk not processed";
    pcVar6 = "KNOWN";
    switch(uVar1) {
    case 1:
      pcVar5 = "DISCARD: known chunk saved";
      goto LAB_0010344e;
    case 2:
      iVar3 = ancillary(name->name);
      if (iVar3 != 0) {
        pcVar5 = "IF-SAFE: known ancillary chunk lost";
        goto LAB_0010342a;
      }
      pcVar5 = "IF-SAFE: known critical chunk saved";
LAB_0010344e:
      pcVar6 = "KNOWN";
LAB_00103455:
      uVar1 = unknown & flag;
joined_r0x0010339e:
      if (uVar1 != 0) goto switchD_001033fa_caseD_0;
      break;
    case 3:
      pcVar5 = "SAVE: known chunk lost";
LAB_0010342a:
      pcVar6 = "KNOWN";
      goto LAB_00103431;
    default:
      pcVar5 = "internal error: bad keep (2)";
      pcVar6 = "KNOWN";
    case 0:
switchD_001033fa_caseD_0:
      d->error_count = d->error_count + 1;
      fprintf(_stderr,"%s(%s%s): %s %s %s: %s\n",d->file,d->test,pcVar4,pcVar6,name,position,pcVar5)
      ;
    }
LAB_001034be:
    chunks = chunks ^ flag;
  } while( true );
}

Assistant:

static void
check_handling(display *d, int def, png_uint_32 chunks, png_uint_32 known,
   png_uint_32 unknown, const char *position, int set_callback)
{
   while (chunks)
   {
      png_uint_32 flag = chunks & -(png_int_32)chunks;
      int i = find_by_flag(flag);
      int keep = chunk_info[i].keep;
      const char *type;
      const char *errorx = NULL;

      if (chunk_info[i].unknown)
      {
         if (keep == PNG_HANDLE_CHUNK_AS_DEFAULT)
         {
            type = "UNKNOWN (default)";
            keep = def;
         }

         else
            type = "UNKNOWN (specified)";

         if (flag & known)
            errorx = "chunk processed";

         else switch (keep)
         {
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
               if (flag & unknown)
                  errorx = "DEFAULT: unknown chunk saved";
               break;

            case PNG_HANDLE_CHUNK_NEVER:
               if (flag & unknown)
                  errorx = "DISCARD: unknown chunk saved";
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (ancillary(chunk_info[i].name))
               {
                  if (!(flag & unknown))
                     errorx = "IF-SAFE: unknown ancillary chunk lost";
               }

               else if (flag & unknown)
                  errorx = "IF-SAFE: unknown critical chunk saved";
               break;

            case PNG_HANDLE_CHUNK_ALWAYS:
               if (!(flag & unknown))
                  errorx = "SAVE: unknown chunk lost";
               break;

            default:
               errorx = "internal error: bad keep";
               break;
         }
      } /* unknown chunk */

      else /* known chunk */
      {
         type = "KNOWN";

         if (flag & known)
         {
            /* chunk was processed, it won't have been saved because that is
             * caught below when checking for inconsistent processing.
             */
            if (keep != PNG_HANDLE_CHUNK_AS_DEFAULT)
               errorx = "!DEFAULT: known chunk processed";
         }

         else /* not processed */ switch (keep)
         {
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
               errorx = "DEFAULT: known chunk not processed";
               break;

            case PNG_HANDLE_CHUNK_NEVER:
               if (flag & unknown)
                  errorx = "DISCARD: known chunk saved";
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (ancillary(chunk_info[i].name))
               {
                  if (!(flag & unknown))
                     errorx = "IF-SAFE: known ancillary chunk lost";
               }

               else if (flag & unknown)
                  errorx = "IF-SAFE: known critical chunk saved";
               break;

            case PNG_HANDLE_CHUNK_ALWAYS:
               if (!(flag & unknown))
                  errorx = "SAVE: known chunk lost";
               break;

            default:
               errorx = "internal error: bad keep (2)";
               break;
         }
      }

      if (errorx != NULL)
      {
         ++(d->error_count);
         fprintf(stderr, "%s(%s%s): %s %s %s: %s\n", d->file, d->test,
            set_callback ? ",callback" : "",
            type, chunk_info[i].name, position, errorx);
      }

      chunks &= ~flag;
   }
}